

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          str_writer<char> *f)

{
  byte bVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  size_t sVar8;
  size_t size_1;
  void *__s;
  void *pvVar9;
  buffer<char> *c;
  size_t sVar10;
  size_t size;
  ulong uVar11;
  ulong uVar12;
  size_t __len;
  size_t __n;
  
  uVar12 = (ulong)(uint)specs->width;
  sVar2 = f->size_;
  sVar10 = sVar2;
  if (uVar12 != 0) {
    if (sVar2 == 0) {
      sVar10 = 0;
    }
    else {
      sVar10 = 0;
      sVar8 = 0;
      do {
        sVar10 = sVar10 + 1;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
    }
  }
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  __n = uVar12 - sVar10;
  if (uVar12 < sVar10 || __n == 0) {
    uVar12 = sVar2 + lVar4;
    if ((ulong)puVar3[3] < uVar12) {
      (**(code **)*puVar3)(puVar3,uVar12);
    }
    puVar3[2] = uVar12;
    sVar2 = f->size_;
    if (sVar2 != 0) {
      pcVar5 = f->s;
      lVar6 = puVar3[1];
      sVar10 = 0;
      do {
        *(char *)(lVar4 + lVar6 + sVar10) = pcVar5[sVar10];
        sVar10 = sVar10 + 1;
      } while (sVar2 != sVar10);
    }
  }
  else {
    uVar11 = ((sVar2 + uVar12) - sVar10) + lVar4;
    if ((ulong)puVar3[3] < uVar11) {
      (**(code **)*puVar3)(puVar3,uVar11);
    }
    puVar3[2] = uVar11;
    __s = (void *)(lVar4 + puVar3[1]);
    bVar1 = (specs->fill).data_[0];
    bVar7 = specs->field_0x9 & 0xf;
    if (bVar7 == 3) {
      uVar11 = __n >> 1;
      if (1 < __n) {
        switchD_00570541::default(__s,(uint)bVar1,uVar11);
        __s = (void *)((long)__s + uVar11);
      }
      sVar2 = f->size_;
      if (sVar2 != 0) {
        pcVar5 = f->s;
        sVar8 = 0;
        do {
          *(char *)((long)__s + sVar8) = pcVar5[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
        __s = (void *)((long)__s + sVar8);
      }
      if (uVar12 != sVar10) {
        __n = __n - uVar11;
LAB_002a8751:
        switchD_00570541::default(__s,(uint)bVar1,__n);
        return;
      }
    }
    else if (bVar7 == 2) {
      pvVar9 = __s;
      if (uVar12 != sVar10) {
        pvVar9 = (void *)((long)__s + __n);
        switchD_00570541::default(__s,(uint)bVar1,__n);
      }
      sVar2 = f->size_;
      if (sVar2 != 0) {
        pcVar5 = f->s;
        sVar10 = 0;
        do {
          *(char *)((long)pvVar9 + sVar10) = pcVar5[sVar10];
          sVar10 = sVar10 + 1;
        } while (sVar2 != sVar10);
      }
    }
    else {
      sVar2 = f->size_;
      if (sVar2 != 0) {
        pcVar5 = f->s;
        sVar8 = 0;
        do {
          *(char *)((long)__s + sVar8) = pcVar5[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
        __s = (void *)((long)__s + sVar8);
      }
      if (uVar12 != sVar10) goto LAB_002a8751;
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }